

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O2

void dlib::cpu::softmax(tensor *dest,tensor *src)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  long lVar8;
  float *pfVar9;
  ostream *poVar10;
  fatal_error *this;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float *pfVar16;
  float *pfVar17;
  long c;
  float *pfVar18;
  long lVar19;
  long i;
  long lVar20;
  long lVar21;
  float temp;
  float fVar22;
  float fVar23;
  string local_1c8;
  ostringstream dlib_o_out;
  uint auStack_190 [88];
  float *pfVar6;
  
  bVar4 = have_same_dimensions(dest,src);
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dlib_o_out);
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"\n\nError detected at line ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,0x4cd);
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in file ");
    poVar10 = std::operator<<(poVar10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                             );
    std::operator<<(poVar10,".\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Error detected in function ");
    poVar10 = std::operator<<(poVar10,"void dlib::cpu::softmax(tensor &, const tensor &)");
    std::operator<<(poVar10,".\n\n");
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"Failing expression was ");
    poVar10 = std::operator<<(poVar10,"have_same_dimensions(dest,src)");
    std::operator<<(poVar10,".\n");
    puVar1 = (uint *)((long)auStack_190 + *(long *)(_dlib_o_out + -0x18));
    *puVar1 = *puVar1 | 1;
    poVar10 = std::operator<<((ostream *)&dlib_o_out,"");
    std::operator<<(poVar10,"\n");
    this = (fatal_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    fatal_error::fatal_error(this,EBROKEN_ASSERT,&local_1c8);
    __cxa_throw(this,&fatal_error::typeinfo,error::~error);
  }
  iVar5 = (*dest->_vptr_tensor[3])(dest);
  pfVar6 = (float *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*src->_vptr_tensor[2])();
  lVar21 = src->m_nr;
  lVar2 = src->m_nc;
  lVar7 = lVar2 * lVar21;
  lVar3 = src->m_k;
  lVar14 = 0;
  lVar13 = lVar3;
  if (lVar3 < 1) {
    lVar13 = lVar14;
  }
  lVar11 = 0;
  if (0 < lVar7) {
    lVar11 = lVar7;
  }
  lVar20 = src->m_n;
  if (src->m_n < 1) {
    lVar20 = lVar14;
  }
  for (; lVar14 != lVar20; lVar14 = lVar14 + 1) {
    lVar8 = lVar14 * lVar7 * lVar3;
    pfVar16 = (float *)(CONCAT44(extraout_var_00,iVar5) + lVar8 * 4);
    pfVar17 = pfVar6 + lVar8;
    for (lVar8 = 0; lVar8 != lVar11; lVar8 = lVar8 + 1) {
      pfVar9 = pfVar16;
      lVar12 = lVar13;
      fVar23 = -INFINITY;
      while (bVar4 = lVar12 != 0, lVar12 = lVar12 + -1, bVar4) {
        fVar22 = *pfVar9;
        if (*pfVar9 <= fVar23) {
          fVar22 = fVar23;
        }
        pfVar9 = pfVar9 + lVar7;
        fVar23 = fVar22;
      }
      lVar15 = 0;
      lVar12 = lVar13;
      while (bVar4 = lVar12 != 0, lVar12 = lVar12 + -1, bVar4) {
        fVar22 = expf(*(float *)((long)pfVar16 + lVar15) - fVar23);
        *(float *)((long)pfVar17 + lVar15) = fVar22;
        lVar15 = lVar15 + lVar7 * 4;
      }
      pfVar16 = pfVar16 + 1;
      pfVar17 = pfVar17 + 1;
    }
  }
  lVar3 = src->m_k;
  lVar14 = 0;
  lVar13 = 0;
  if (0 < lVar3) {
    lVar13 = lVar3;
  }
  lVar11 = 0;
  if (0 < lVar2) {
    lVar11 = lVar2;
  }
  if (lVar21 < 1) {
    lVar21 = lVar14;
  }
  for (; lVar14 != lVar20; lVar14 = lVar14 + 1) {
    pfVar16 = pfVar6;
    for (lVar8 = 0; lVar8 != lVar21; lVar8 = lVar8 + 1) {
      pfVar17 = pfVar16;
      for (lVar12 = 0; lVar12 != lVar11; lVar12 = lVar12 + 1) {
        fVar23 = 0.0;
        pfVar9 = pfVar17;
        lVar15 = lVar13;
        while (bVar4 = lVar15 != 0, lVar15 = lVar15 + -1, pfVar18 = pfVar17, lVar19 = lVar13, bVar4)
        {
          fVar23 = fVar23 + *pfVar9;
          pfVar9 = pfVar9 + lVar7;
        }
        while (lVar19 != 0) {
          *pfVar18 = *pfVar18 / fVar23;
          pfVar18 = pfVar18 + lVar7;
          lVar19 = lVar19 + -1;
        }
        pfVar17 = pfVar17 + 1;
      }
      pfVar16 = pfVar16 + lVar2;
    }
    pfVar6 = pfVar6 + lVar7 * lVar3;
  }
  return;
}

Assistant:

void softmax (
            tensor& dest,
            const tensor& src
        )
        {
            DLIB_CASSERT(have_same_dimensions(dest,src));
            const auto d = dest.host();
            const auto s = src.host();

            const long num = src.nr()*src.nc();
            // Note that we subtract out the max values in each channel before applying
            // exp() to avoid numeric overflow in the subsequent computations.  Doing this
            // doesn't change the resulting output, it just makes it more numerically
            // stable.
            for (long n = 0; n < src.num_samples(); ++n)
            {
                auto ss = s + num*src.k()*n;
                auto dd = d + num*src.k()*n;
                for (long i = 0; i < num; ++i)
                {
                    float max_val = -std::numeric_limits<float>::infinity();
                    for (long k = 0; k < src.k(); ++k)
                        max_val = std::max(max_val, ss[k*num]);

                    for (long k = 0; k < src.k(); ++k)
                        dd[k*num] = std::exp(ss[k*num]-max_val);

                    ++ss;
                    ++dd;
                }
            }

            // Now normalize each channel so they sum to 1.
            for (long n = 0; n < src.num_samples(); ++n)
            {
                const auto dd = d + num*src.k()*n;
                for (long r = 0; r < src.nr(); ++r)
                {
                    for (long c = 0; c < src.nc(); ++c)
                    {
                        const auto ddd = dd+r*src.nc()+c;

                        float temp = 0;
                        for (long k = 0; k < src.k(); ++k)
                            temp += ddd[k*num];
                        for (long k = 0; k < src.k(); ++k)
                            ddd[k*num] /= temp;
                    }
                }
            }
        }